

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int cm_expat_XML_SetBase(XML_Parser parser,XML_Char *p)

{
  XML_Char *pXVar1;
  
  if (p == (XML_Char *)0x0) {
    pXVar1 = (XML_Char *)0x0;
  }
  else {
    pXVar1 = poolCopyString((STRING_POOL *)((long)parser + 0x330),p);
    if (pXVar1 == (XML_Char *)0x0) {
      return 0;
    }
  }
  *(XML_Char **)((long)parser + 0x3c8) = pXVar1;
  return 1;
}

Assistant:

int XML_SetBase(XML_Parser parser, const XML_Char *p)
{
  if (p) {
    p = poolCopyString(&dtd.pool, p);
    if (!p)
      return 0;
    curBase = p;
  }
  else
    curBase = 0;
  return 1;
}